

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<Unique_Ptr_Test_Class>
          (Object_Data *this,
          unique_ptr<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_> *obj,
          bool t_return_value)

{
  Unique_Ptr_Test_Class *pUVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar4;
  
  pUVar1 = (obj->_M_t).
           super___uniq_ptr_impl<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>
           ._M_t.
           super__Tuple_impl<0UL,_Unique_Ptr_Test_Class_*,_std::default_delete<Unique_Ptr_Test_Class>_>
           .super__Head_base<0UL,_Unique_Ptr_Test_Class_*,_false>._M_head_impl;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_005b6f20;
  puVar2[2] = (obj->_M_t).
              super___uniq_ptr_impl<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>
              ._M_t.
              super__Tuple_impl<0UL,_Unique_Ptr_Test_Class_*,_std::default_delete<Unique_Ptr_Test_Class>_>
              .super__Head_base<0UL,_Unique_Ptr_Test_Class_*,_false>._M_head_impl;
  (obj->_M_t).
  super___uniq_ptr_impl<Unique_Ptr_Test_Class,_std::default_delete<Unique_Ptr_Test_Class>_>._M_t.
  super__Tuple_impl<0UL,_Unique_Ptr_Test_Class_*,_std::default_delete<Unique_Ptr_Test_Class>_>.
  super__Head_base<0UL,_Unique_Ptr_Test_Class_*,_false>._M_head_impl = (Unique_Ptr_Test_Class *)0x0;
  puVar3 = (undefined8 *)operator_new(0x20);
  puVar3[1] = &std::
               shared_ptr<std::unique_ptr<Unique_Ptr_Test_Class,std::default_delete<Unique_Ptr_Test_Class>>>
               ::typeinfo;
  *puVar3 = &PTR__Data_Impl_005b6fb0;
  puVar3[2] = puVar2 + 2;
  puVar3[3] = puVar2;
  *(undefined8 *)this = 0;
  puVar2 = (undefined8 *)operator_new(0x50);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_005a4808;
  puVar2[2] = &Unique_Ptr_Test_Class::typeinfo;
  puVar2[3] = &Unique_Ptr_Test_Class::typeinfo;
  *(undefined4 *)(puVar2 + 4) = 0;
  puVar2[5] = puVar3;
  puVar2[6] = pUVar1;
  puVar2[7] = pUVar1;
  puVar2[8] = 0;
  *(undefined1 *)(puVar2 + 9) = 1;
  *(bool *)((long)puVar2 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&Unique_Ptr_Test_Class::typeinfo;
  sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::unique_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(),
                                      chaiscript::detail::Any(std::make_shared<std::unique_ptr<T>>(std::move(obj))),
                                      true,
                                      ptr,
                                      t_return_value);
      }